

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::literal::name_abi_cxx11_(string *__return_storage_ptr__,literal *this)

{
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"literal{",&local_71);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,this->value_,this->value_ + this->size_);
  std::operator+(&local_30,&local_50,&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,&local_30,"}");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string literal::name() const
{
    return std::string("literal{") + std::string(value_, size_) + "}";
}